

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_Equals_Test<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Equals_Test<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  value_type this_00;
  value_type file;
  AssertionResult gtest_ar__12;
  int i_1;
  int i;
  AssertionResult gtest_ar__11;
  AssertionResult gtest_ar__10;
  AssertionResult gtest_ar__9;
  AssertionResult gtest_ar__8;
  AssertionResult gtest_ar__7;
  TypeParam ht3;
  Alloc<int,_unsigned_long,_18446744073709551615UL> alloc;
  hasher hasher;
  AssertionResult gtest_ar__6;
  AssertionResult gtest_ar__5;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  TypeParam ht2;
  TypeParam ht1;
  HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff8f8;
  undefined7 in_stack_fffffffffffff900;
  undefined1 in_stack_fffffffffffff907;
  undefined8 in_stack_fffffffffffff908;
  value_type in_stack_fffffffffffff910;
  undefined4 in_stack_fffffffffffff918;
  int in_stack_fffffffffffff91c;
  int iVar5;
  hasher *in_stack_fffffffffffff920;
  undefined4 in_stack_fffffffffffff928;
  undefined2 in_stack_fffffffffffff92c;
  undefined1 in_stack_fffffffffffff92e;
  undefined1 in_stack_fffffffffffff92f;
  HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_fffffffffffff930;
  Hasher *this_01;
  Hasher *this_02;
  Alloc<int,_unsigned_long,_18446744073709551615UL> *this_03;
  AssertionResult *in_stack_fffffffffffff978;
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff980;
  AssertionResult local_650 [3];
  value_type local_614;
  int local_60c;
  value_type local_5dc;
  int local_5d4;
  string local_5d0 [55];
  undefined1 local_599;
  AssertionResult local_598 [3];
  value_type local_560;
  string local_558 [55];
  byte local_521;
  AssertionResult local_520;
  string local_510 [55];
  undefined1 local_4d9;
  AssertionResult local_4d8 [3];
  value_type local_4a0;
  string local_498 [55];
  byte local_461;
  AssertionResult local_460;
  string local_450 [55];
  undefined1 local_419;
  AssertionResult local_418 [9];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_388;
  Hasher local_374;
  string local_368 [55];
  undefined1 local_331;
  AssertionResult local_330;
  string local_320 [55];
  byte local_2e9;
  AssertionResult local_2e8;
  string local_2d8 [55];
  undefined1 local_2a1;
  AssertionResult local_2a0;
  key_type local_28c;
  string local_288 [55];
  byte local_251;
  AssertionResult local_250;
  string local_240 [55];
  undefined1 local_209;
  AssertionResult local_208;
  string local_1f8 [55];
  byte local_1c1;
  AssertionResult local_1c0;
  string local_1b0 [55];
  undefined1 local_179;
  AssertionResult local_178;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_168;
  Hasher local_158;
  Hasher local_14c [13];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_b0;
  Hasher local_a0;
  Hasher local_94 [12];
  
  iVar5 = (int)((ulong)in_stack_fffffffffffff908 >> 0x20);
  this_01 = local_94;
  Hasher::Hasher(this_01,0);
  this_02 = &local_a0;
  Hasher::Hasher(this_02,0);
  this_03 = &local_b0;
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(this_03,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashMap
            (in_stack_fffffffffffff930,
             CONCAT17(in_stack_fffffffffffff92f,
                      CONCAT16(in_stack_fffffffffffff92e,
                               CONCAT24(in_stack_fffffffffffff92c,in_stack_fffffffffffff928))),
             in_stack_fffffffffffff920,
             (key_equal *)CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918),
             (allocator_type *)in_stack_fffffffffffff910);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_b0);
  Hasher::Hasher(local_14c,0);
  Hasher::Hasher(&local_158,0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_168,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashMap
            (in_stack_fffffffffffff930,
             CONCAT17(in_stack_fffffffffffff92f,
                      CONCAT16(in_stack_fffffffffffff92e,
                               CONCAT24(in_stack_fffffffffffff92c,in_stack_fffffffffffff928))),
             in_stack_fffffffffffff920,
             (key_equal *)CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918),
             (allocator_type *)in_stack_fffffffffffff910);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_168);
  local_179 = google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::operator==((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900),
                           (BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)in_stack_fffffffffffff8f8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900),
             (bool *)in_stack_fffffffffffff8f8,(type *)0xed8e80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_178);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff930);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff978,(char *)this_03,(char *)this_02,(char *)this_01);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff930,
               CONCAT13(in_stack_fffffffffffff92f,
                        CONCAT12(in_stack_fffffffffffff92e,in_stack_fffffffffffff92c)),
               (char *)in_stack_fffffffffffff920,in_stack_fffffffffffff91c,
               (char *)in_stack_fffffffffffff910);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff980,(Message *)in_stack_fffffffffffff978);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900));
    std::__cxx11::string::~string(local_1b0);
    testing::Message::~Message((Message *)0xed8fc4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xed9058);
  bVar1 = google::
          BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator!=((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900),
                       (BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)in_stack_fffffffffffff8f8);
  local_1c1 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900),
             (bool *)in_stack_fffffffffffff8f8,(type *)0xed9096);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1c0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff930);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff978,(char *)this_03,(char *)this_02,(char *)this_01);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff930,
               CONCAT13(in_stack_fffffffffffff92f,
                        CONCAT12(in_stack_fffffffffffff92e,in_stack_fffffffffffff92c)),
               (char *)in_stack_fffffffffffff920,in_stack_fffffffffffff91c,
               (char *)in_stack_fffffffffffff910);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff980,(Message *)in_stack_fffffffffffff978);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900));
    std::__cxx11::string::~string(local_1f8);
    testing::Message::~Message((Message *)0xed916b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xed91ff);
  local_209 = google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::operator==((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900),
                           (BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)in_stack_fffffffffffff8f8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900),
             (bool *)in_stack_fffffffffffff8f8,(type *)0xed9240);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_208);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff930);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff978,(char *)this_03,(char *)this_02,(char *)this_01);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff930,
               CONCAT13(in_stack_fffffffffffff92f,
                        CONCAT12(in_stack_fffffffffffff92e,in_stack_fffffffffffff92c)),
               (char *)in_stack_fffffffffffff920,in_stack_fffffffffffff91c,
               (char *)in_stack_fffffffffffff910);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff980,(Message *)in_stack_fffffffffffff978);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900));
    std::__cxx11::string::~string(local_240);
    testing::Message::~Message((Message *)0xed9315);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xed93a9);
  bVar1 = google::
          BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator!=((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900),
                       (BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)in_stack_fffffffffffff8f8);
  local_251 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900),
             (bool *)in_stack_fffffffffffff8f8,(type *)0xed93ec);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_250);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff930);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff978,(char *)this_03,(char *)this_02,(char *)this_01);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff930,
               CONCAT13(in_stack_fffffffffffff92f,
                        CONCAT12(in_stack_fffffffffffff92e,in_stack_fffffffffffff92c)),
               (char *)in_stack_fffffffffffff920,in_stack_fffffffffffff91c,
               (char *)in_stack_fffffffffffff910);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff980,(Message *)in_stack_fffffffffffff978);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900));
    std::__cxx11::string::~string(local_288);
    testing::Message::~Message((Message *)0xed94c1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xed9558);
  local_28c = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)in_stack_fffffffffffff910,iVar5);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                     *)CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900),
                    (key_type *)in_stack_fffffffffffff8f8);
  local_2a1 = google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::operator==((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900),
                           (BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)in_stack_fffffffffffff8f8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900),
             (bool *)in_stack_fffffffffffff8f8,(type *)0xed95d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2a0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff930);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff978,(char *)this_03,(char *)this_02,(char *)this_01);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff930,
               CONCAT13(in_stack_fffffffffffff92f,
                        CONCAT12(in_stack_fffffffffffff92e,in_stack_fffffffffffff92c)),
               (char *)in_stack_fffffffffffff920,in_stack_fffffffffffff91c,
               (char *)in_stack_fffffffffffff910);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff980,(Message *)in_stack_fffffffffffff978);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900));
    std::__cxx11::string::~string(local_2d8);
    testing::Message::~Message((Message *)0xed96a5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xed9739);
  bVar1 = google::
          BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator!=((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900),
                       (BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)in_stack_fffffffffffff8f8);
  local_2e9 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900),
             (bool *)in_stack_fffffffffffff8f8,(type *)0xed977c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2e8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff930);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff978,(char *)this_03,(char *)this_02,(char *)this_01);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff930,
               CONCAT13(in_stack_fffffffffffff92f,
                        CONCAT12(in_stack_fffffffffffff92e,in_stack_fffffffffffff92c)),
               (char *)in_stack_fffffffffffff920,in_stack_fffffffffffff91c,
               (char *)in_stack_fffffffffffff910);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff980,(Message *)in_stack_fffffffffffff978);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900));
    std::__cxx11::string::~string(local_320);
    testing::Message::~Message((Message *)0xed9851);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xed98e5);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::resize((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900),
           (size_type)in_stack_fffffffffffff8f8);
  local_331 = google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::operator==((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900),
                           (BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)in_stack_fffffffffffff8f8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900),
             (bool *)in_stack_fffffffffffff8f8,(type *)0xed993a);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_330);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff930);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff978,(char *)this_03,(char *)this_02,(char *)this_01);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff930,
               CONCAT13(in_stack_fffffffffffff92f,
                        CONCAT12(in_stack_fffffffffffff92e,in_stack_fffffffffffff92c)),
               (char *)in_stack_fffffffffffff920,in_stack_fffffffffffff91c,
               (char *)in_stack_fffffffffffff910);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff980,(Message *)in_stack_fffffffffffff978);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900));
    std::__cxx11::string::~string(local_368);
    testing::Message::~Message((Message *)0xed9a0f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xed9aa6);
  Hasher::Hasher(&local_374,1);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_388,2,(int *)0x0);
  google::
  HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashMap
            (in_stack_fffffffffffff930,
             CONCAT17(in_stack_fffffffffffff92f,
                      CONCAT16(in_stack_fffffffffffff92e,
                               CONCAT24(in_stack_fffffffffffff92c,in_stack_fffffffffffff928))),
             in_stack_fffffffffffff920,
             (key_equal *)CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918),
             (allocator_type *)in_stack_fffffffffffff910);
  local_419 = google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::operator==((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900),
                           (BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)in_stack_fffffffffffff8f8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900),
             (bool *)in_stack_fffffffffffff8f8,(type *)0xed9b3a);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_418);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff930);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff978,(char *)this_03,(char *)this_02,(char *)this_01);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff930,
               CONCAT13(in_stack_fffffffffffff92f,
                        CONCAT12(in_stack_fffffffffffff92e,in_stack_fffffffffffff92c)),
               (char *)in_stack_fffffffffffff920,in_stack_fffffffffffff91c,
               (char *)in_stack_fffffffffffff910);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff980,(Message *)in_stack_fffffffffffff978);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900));
    std::__cxx11::string::~string(local_450);
    testing::Message::~Message((Message *)0xed9c41);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xed9cd5);
  bVar1 = google::
          BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator!=((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900),
                       (BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)in_stack_fffffffffffff8f8);
  local_461 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900),
             (bool *)in_stack_fffffffffffff8f8,(type *)0xed9d18);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_460);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff930);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff978,(char *)this_03,(char *)this_02,(char *)this_01);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff930,
               CONCAT13(in_stack_fffffffffffff92f,
                        CONCAT12(in_stack_fffffffffffff92e,in_stack_fffffffffffff92c)),
               (char *)in_stack_fffffffffffff920,in_stack_fffffffffffff91c,
               (char *)in_stack_fffffffffffff910);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff980,(Message *)in_stack_fffffffffffff978);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900));
    std::__cxx11::string::~string(local_498);
    testing::Message::~Message((Message *)0xed9ded);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xed9e84);
  this_00 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueObject(in_stack_fffffffffffff8f8,0);
  local_4a0 = this_00;
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff980,(value_type *)in_stack_fffffffffffff978);
  uVar2 = google::
          BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator!=((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900),
                       (BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)in_stack_fffffffffffff8f8);
  local_4d9 = uVar2;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900),
             (bool *)in_stack_fffffffffffff8f8,(type *)0xed9f07);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_4d8);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff978,(char *)this_03,(char *)this_02,(char *)this_01);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_00,
               CONCAT13(uVar2,CONCAT12(in_stack_fffffffffffff92e,in_stack_fffffffffffff92c)),
               (char *)in_stack_fffffffffffff920,in_stack_fffffffffffff91c,
               (char *)in_stack_fffffffffffff910);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff980,(Message *)in_stack_fffffffffffff978);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900));
    std::__cxx11::string::~string(local_510);
    testing::Message::~Message((Message *)0xed9fdc);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xeda070);
  uVar3 = google::
          BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900),
                       (BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)in_stack_fffffffffffff8f8);
  local_521 = ~uVar3 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900),
             (bool *)in_stack_fffffffffffff8f8,(type *)0xeda0b3);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_520);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff978,(char *)this_03,(char *)this_02,(char *)this_01);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_00,CONCAT13(uVar2,CONCAT12(uVar3,in_stack_fffffffffffff92c)),
               (char *)in_stack_fffffffffffff920,in_stack_fffffffffffff91c,
               (char *)in_stack_fffffffffffff910);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff980,(Message *)in_stack_fffffffffffff978);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900));
    std::__cxx11::string::~string(local_558);
    testing::Message::~Message((Message *)0xeda188);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xeda21f);
  file = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ::UniqueObject(in_stack_fffffffffffff8f8,0);
  local_560 = file;
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff980,(value_type *)in_stack_fffffffffffff978);
  local_599 = google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::operator==((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900),
                           (BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)in_stack_fffffffffffff8f8);
  iVar5 = CONCAT13(local_599,(int3)in_stack_fffffffffffff91c);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900),
             (bool *)in_stack_fffffffffffff8f8,(type *)0xeda2a2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_598);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff978,(char *)this_03,(char *)this_02,(char *)this_01);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_00,CONCAT13(uVar2,CONCAT12(uVar3,in_stack_fffffffffffff92c)),
               (char *)file,iVar5,(char *)in_stack_fffffffffffff910);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff980,(Message *)in_stack_fffffffffffff978);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900));
    std::__cxx11::string::~string(local_5d0);
    testing::Message::~Message((Message *)0xeda377);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xeda40b);
  for (local_5d4 = 3; local_5d4 < 0x7d1; local_5d4 = local_5d4 + 1) {
    in_stack_fffffffffffff910 =
         HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ::UniqueObject(in_stack_fffffffffffff8f8,0);
    local_5dc = in_stack_fffffffffffff910;
    google::
    BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffff980,(value_type *)in_stack_fffffffffffff978);
  }
  for (local_60c = 2000; 2 < local_60c; local_60c = local_60c + -1) {
    local_614 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject(in_stack_fffffffffffff8f8,0);
    google::
    BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffff980,(value_type *)in_stack_fffffffffffff978);
  }
  uVar4 = google::
          BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900),
                       (BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)in_stack_fffffffffffff8f8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(uVar4,in_stack_fffffffffffff900),
             (bool *)in_stack_fffffffffffff8f8,(type *)0xeda53d);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_650);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff978,(char *)this_03,(char *)this_02,(char *)this_01);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_00,CONCAT13(uVar2,CONCAT12(uVar3,in_stack_fffffffffffff92c)),
               (char *)file,iVar5,(char *)in_stack_fffffffffffff910);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff980,(Message *)in_stack_fffffffffffff978);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(uVar4,in_stack_fffffffffffff900));
    std::__cxx11::string::~string((string *)&stack0xfffffffffffff978);
    testing::Message::~Message((Message *)0xeda600);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xeda694);
  google::
  HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashMap
            ((HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xeda6a1);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_388);
  google::
  HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashMap
            ((HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xeda6bb);
  google::
  HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashMap
            ((HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xeda6c8);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Equals) {
  // The real test here is whether two hashtables are equal if they
  // have the same items but in a different order.
  TypeParam ht1;
  TypeParam ht2;

  EXPECT_TRUE(ht1 == ht1);
  EXPECT_FALSE(ht1 != ht1);
  EXPECT_TRUE(ht1 == ht2);
  EXPECT_FALSE(ht1 != ht2);
  ht1.set_deleted_key(this->UniqueKey(1));
  // Only the contents affect equality, not things like deleted-key.
  EXPECT_TRUE(ht1 == ht2);
  EXPECT_FALSE(ht1 != ht2);
  ht1.resize(2000);
  EXPECT_TRUE(ht1 == ht2);

  // The choice of allocator/etc doesn't matter either.
  typename TypeParam::hasher hasher(1);
  Alloc<typename TypeParam::key_type> alloc(2, NULL);
  TypeParam ht3(5, hasher, hasher, alloc);
  EXPECT_TRUE(ht1 == ht3);
  EXPECT_FALSE(ht1 != ht3);

  ht1.insert(this->UniqueObject(2));
  EXPECT_TRUE(ht1 != ht2);
  EXPECT_FALSE(ht1 == ht2);  // this should hold as well!

  ht2.insert(this->UniqueObject(2));
  EXPECT_TRUE(ht1 == ht2);

  for (int i = 3; i <= 2000; i++) {
    ht1.insert(this->UniqueObject(i));
  }
  for (int i = 2000; i >= 3; i--) {
    ht2.insert(this->UniqueObject(i));
  }
  EXPECT_TRUE(ht1 == ht2);
}